

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_IUP(TT_ExecContext exc)

{
  FT_UInt p2;
  FT_UInt p1;
  FT_UInt ref2;
  bool bVar1;
  short local_4a;
  FT_UInt local_48;
  uint uStack_44;
  FT_Short contour;
  FT_UInt point;
  FT_UInt cur_touched;
  FT_UInt first_touched;
  FT_UInt end_point;
  FT_UInt first_point;
  FT_Byte mask;
  IUP_WorkerRec V;
  TT_ExecContext exc_local;
  
  if ((*(int *)&(exc->face->root).driver[2].root.library == 0x28) &&
     (exc->backward_compatibility != '\0')) {
    if ((exc->iupx_called != '\0') && (exc->iupy_called != '\0')) {
      return;
    }
    if ((exc->opcode & 1) == 0) {
      exc->iupy_called = '\x01';
    }
    else {
      exc->iupx_called = '\x01';
    }
  }
  if ((exc->pts).n_contours != 0) {
    if ((exc->opcode & 1) == 0) {
      end_point._3_1_ = 0x10;
      _first_point = (FT_Vector *)&((exc->pts).org)->y;
      V.orgs = (FT_Vector *)&((exc->pts).cur)->y;
      V.curs = (FT_Vector *)&((exc->pts).orus)->y;
    }
    else {
      end_point._3_1_ = 8;
      _first_point = (exc->pts).org;
      V.orgs = (exc->pts).cur;
      V.curs = (exc->pts).orus;
    }
    V.orus._0_4_ = (uint)(exc->pts).n_points;
    local_4a = 0;
    local_48 = 0;
    V._24_8_ = exc;
    do {
      p1 = local_48;
      cur_touched = (uint)*(ushort *)(*(long *)(V._24_8_ + 0x138) + (long)local_4a * 2) -
                    (uint)*(ushort *)(V._24_8_ + 0x140);
      if (*(ushort *)(V._24_8_ + 0x114) <= cur_touched) {
        cur_touched = *(ushort *)(V._24_8_ + 0x114) - 1;
      }
      while( true ) {
        ref2 = local_48;
        bVar1 = false;
        if (local_48 <= cur_touched) {
          bVar1 = (*(byte *)(*(long *)(V._24_8_ + 0x130) + (ulong)local_48) & end_point._3_1_) == 0;
        }
        if (!bVar1) break;
        local_48 = local_48 + 1;
      }
      if (local_48 <= cur_touched) {
        uStack_44 = local_48;
        while (p2 = local_48, local_48 = p2 + 1, local_48 <= cur_touched) {
          if ((*(byte *)(*(long *)(V._24_8_ + 0x130) + (ulong)local_48) & end_point._3_1_) != 0) {
            iup_worker_interpolate_((IUP_Worker)&first_point,uStack_44 + 1,p2,uStack_44,local_48);
            uStack_44 = local_48;
          }
        }
        if (uStack_44 == ref2) {
          iup_worker_shift_((IUP_Worker)&first_point,p1,cur_touched,uStack_44);
        }
        else {
          iup_worker_interpolate_
                    ((IUP_Worker)&first_point,uStack_44 + 1 & 0xffff,cur_touched,uStack_44,ref2);
          if (ref2 != 0) {
            iup_worker_interpolate_((IUP_Worker)&first_point,p1,ref2 - 1,uStack_44,ref2);
          }
        }
      }
      local_4a = local_4a + 1;
    } while (local_4a < *(short *)(V._24_8_ + 0x116));
  }
  return;
}

Assistant:

static void
  Ins_IUP( TT_ExecContext  exc )
  {
    IUP_WorkerRec  V;
    FT_Byte        mask;

    FT_UInt   first_point;   /* first point of contour        */
    FT_UInt   end_point;     /* end point (last+1) of contour */

    FT_UInt   first_touched; /* first touched point in contour   */
    FT_UInt   cur_touched;   /* current touched point in contour */

    FT_UInt   point;         /* current point   */
    FT_Short  contour;       /* current contour */


#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    /* See `ttinterp.h' for details on backward compatibility mode.  */
    /* Allow IUP until it has been called on both axes.  Immediately */
    /* return on subsequent ones.                                    */
    if ( SUBPIXEL_HINTING_MINIMAL    &&
         exc->backward_compatibility )
    {
      if ( exc->iupx_called && exc->iupy_called )
        return;

      if ( exc->opcode & 1 )
        exc->iupx_called = TRUE;
      else
        exc->iupy_called = TRUE;
    }
#endif

    /* ignore empty outlines */
    if ( exc->pts.n_contours == 0 )
      return;

    if ( exc->opcode & 1 )
    {
      mask   = FT_CURVE_TAG_TOUCH_X;
      V.orgs = exc->pts.org;
      V.curs = exc->pts.cur;
      V.orus = exc->pts.orus;
    }
    else
    {
      mask   = FT_CURVE_TAG_TOUCH_Y;
      V.orgs = (FT_Vector*)( (FT_Pos*)exc->pts.org + 1 );
      V.curs = (FT_Vector*)( (FT_Pos*)exc->pts.cur + 1 );
      V.orus = (FT_Vector*)( (FT_Pos*)exc->pts.orus + 1 );
    }
    V.max_points = exc->pts.n_points;

    contour = 0;
    point   = 0;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY &&
         exc->ignore_x_mode          )
    {
      exc->iup_called = TRUE;
      if ( exc->sph_tweak_flags & SPH_TWEAK_SKIP_IUP )
        return;
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    do
    {
      end_point   = exc->pts.contours[contour] - exc->pts.first_point;
      first_point = point;

      if ( BOUNDS( end_point, exc->pts.n_points ) )
        end_point = exc->pts.n_points - 1;

      while ( point <= end_point && ( exc->pts.tags[point] & mask ) == 0 )
        point++;

      if ( point <= end_point )
      {
        first_touched = point;
        cur_touched   = point;

        point++;

        while ( point <= end_point )
        {
          if ( ( exc->pts.tags[point] & mask ) != 0 )
          {
            iup_worker_interpolate_( &V,
                                     cur_touched + 1,
                                     point - 1,
                                     cur_touched,
                                     point );
            cur_touched = point;
          }

          point++;
        }

        if ( cur_touched == first_touched )
          iup_worker_shift_( &V, first_point, end_point, cur_touched );
        else
        {
          iup_worker_interpolate_( &V,
                                   (FT_UShort)( cur_touched + 1 ),
                                   end_point,
                                   cur_touched,
                                   first_touched );

          if ( first_touched > 0 )
            iup_worker_interpolate_( &V,
                                     first_point,
                                     first_touched - 1,
                                     cur_touched,
                                     first_touched );
        }
      }
      contour++;
    } while ( contour < exc->pts.n_contours );
  }